

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O3

bool __thiscall
MeteomaticsApiClient::readMultiPointTimeSeriesBin
          (MeteomaticsApiClient *this,MemoryClass *mem,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *results,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *times)

{
  ulong uVar1;
  int iVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double extraout_XMM0_Qa_00;
  vector<double,_std::allocator<double>_> tmpValues;
  double value;
  Matrix tmpMat;
  int local_a8;
  int local_a4;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_70;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  MeteomaticsApiClient *local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  pointer local_38;
  
  uVar1 = mem->readPos + 4;
  pcVar3 = (mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar1 <= (ulong)((long)(mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pcVar3)) {
    iVar2 = *(int *)(pcVar3 + mem->readPos);
    mem->readPos = uVar1;
    if (0 < iVar2) {
      iVar7 = 0;
      local_70 = results;
      local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)times;
      local_60 = this;
      do {
        uVar1 = mem->readPos + 4;
        pcVar3 = (mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (uVar1 <= (ulong)((long)(mem->mem).super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pcVar3)) {
          local_a8 = *(int *)(pcVar3 + mem->readPos);
          mem->readPos = uVar1;
        }
        local_48 = (undefined1  [16])0x0;
        local_38 = (pointer)0x0;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::reserve((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_48,(long)local_a8);
        if (0 < local_a8) {
          iVar6 = 0;
          do {
            uVar4 = mem->readPos;
            uVar1 = uVar4 + 4;
            pcVar3 = (mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = (long)(mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pcVar3;
            if (uVar1 <= uVar5) {
              local_a4 = *(int *)(pcVar3 + uVar4);
              mem->readPos = uVar1;
              uVar4 = uVar1;
            }
            if (uVar4 + 8 <= uVar5) {
              local_58 = *(double *)(pcVar3 + uVar4);
              mem->readPos = uVar4 + 8;
            }
            convDateIso8601_abi_cxx11_((string *)local_98,local_60,local_58);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_68,(string *)local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._0_8_ != &local_88) {
              operator_delete((void *)local_98._0_8_);
            }
            local_98 = (undefined1  [16])0x0;
            local_88._M_allocated_capacity = 0;
            std::vector<double,_std::allocator<double>_>::reserve
                      ((vector<double,_std::allocator<double>_> *)local_98,(long)local_a4);
            iVar8 = local_a4;
            dVar9 = extraout_XMM0_Qa;
            if (0 < local_a4) {
              do {
                uVar1 = mem->readPos + 8;
                pcVar3 = (mem->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (uVar1 <= (ulong)((long)(mem->mem).
                                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                           super__Vector_impl_data._M_finish - (long)pcVar3)) {
                  dVar9 = *(double *)(pcVar3 + mem->readPos);
                  mem->readPos = uVar1;
                  local_50 = dVar9;
                }
                if (local_98._8_8_ == local_88._M_allocated_capacity) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)local_98,
                             (iterator)local_98._8_8_,&local_50);
                  dVar9 = extraout_XMM0_Qa_00;
                }
                else {
                  *(double *)local_98._8_8_ = dVar9;
                  local_98._8_8_ = (double *)(local_98._8_8_ + 8);
                }
                iVar8 = iVar8 + -1;
              } while (iVar8 != 0);
            }
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)local_48,(value_type *)local_98);
            if ((pointer)local_98._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_98._0_8_);
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 != local_a8);
        }
        std::
        vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ::push_back(local_70,(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)local_48);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_48);
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar2);
    }
  }
  return true;
}

Assistant:

bool MeteomaticsApiClient::readMultiPointTimeSeriesBin(MMIntern::MemoryClass& mem, std::vector<Matrix>& results, std::vector<std::string>& times) const
{
    int32_t nCoords;
    mem.read(nCoords);
    
    for (int32_t i=0; i<nCoords; i++)
    {
        int32_t nTimes;
        mem.read(nTimes);
        
        Matrix tmpMat;
        tmpMat.reserve(nTimes);
        for (int32_t j=0; j<nTimes; j++)
        {
            int32_t nParameter;
            mem.read(nParameter);
            
            double t;
            mem.read(t);
            times.push_back(convDateIso8601(t));
            
            std::vector<double> tmpValues;
            tmpValues.reserve(nParameter);
            for (int32_t k=0; k<nParameter; k++)
            {
                double value;
                mem.read(value);
                tmpValues.push_back(value);
            }
            tmpMat.push_back(tmpValues);
        }
        results.push_back(tmpMat);
    }
    
    return true;
}